

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

int __thiscall
CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
          (CSHRSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,int n,
          SHMPTR *shridpObjs)

{
  SHMPTR SVar1;
  LPVOID __s;
  _USHRSynchCacheStackNode *p_Var2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var2 = (this->m_pHead).m_val;
  uVar6 = 0;
  if (0 < n && p_Var2 != (_USHRSynchCacheStackNode *)0x0) {
    uVar6 = 0;
    do {
      shridpObjs[uVar6] = *(SHMPTR *)((long)p_Var2 + 8);
      p_Var2 = (p_Var2->pointers).pNext;
      uVar6 = uVar6 + 1;
      if (p_Var2 == (_USHRSynchCacheStackNode *)0x0) break;
    } while (uVar6 < (uint)n);
  }
  (this->m_pHead).m_val = p_Var2;
  iVar5 = (int)uVar6;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - iVar5;
  if (((this->m_pHead).m_val == (_USHRSynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  if (((this->m_iDepth).m_val == 0) && (0 < this->m_iMaxDepth / 10 + (iVar5 - n))) {
    iVar4 = 0;
    do {
      SVar1 = SHMalloc(0x40);
      if (SVar1 == 0) {
        Flush(this,pthrCurrent,true);
        break;
      }
      p_Var2 = (_USHRSynchCacheStackNode *)SHMPtrToPtr(SVar1);
      memset(p_Var2,0,0x40);
      (p_Var2->pointers).shrid = SVar1;
      (p_Var2->pointers).pNext = (this->m_pHead).m_val;
      (this->m_pHead).m_val = p_Var2;
      (this->m_iDepth).m_val = (this->m_iDepth).m_val + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_iMaxDepth / 10 + (iVar5 - n));
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if (iVar5 < n) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      SVar1 = SHMalloc(0x40);
      if (SVar1 == 0) goto LAB_0034631f;
      __s = SHMPtrToPtr(SVar1);
      memset(__s,0,0x40);
      shridpObjs[uVar6] = SVar1;
      uVar6 = uVar6 + 1;
    } while ((long)n != uVar6);
    uVar6 = (ulong)(uint)n;
  }
LAB_0034631f:
  if (0 < (int)uVar6) {
    uVar3 = 0;
    do {
      SHMPtrToPtr(shridpObjs[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uVar6 & 0xffffffff) != uVar3);
  }
  return (int)uVar6;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, SharedID * shridpObjs)
        {
            SharedID shridObj;
            void * pvObjRaw = NULL;
            USHRSynchCacheStackNode * pNode;
            int i = 0, j, k;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {            
                shridpObjs[i] = pNode->pointers.shrid;
                pvObjRaw = (void *)pNode;
                pNode = pNode->pointers.pNext;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                    // Can't use ASSERT here, since this is header
                    // (see comment above)
                    fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                    DebugBreak();
            }
#endif // _DEBUG

            if (0 == m_iDepth)
            {
                for (k=0; k<m_iMaxDepth/PreAllocFactor-n+i; k++)
                {
                    shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                    if (NULLSharedID == shridObj)
                    {
                        Flush(pthrCurrent, true);
                        break;
                    }
                    pNode = SharedIDToTypePointer(USHRSynchCacheStackNode, shridObj);
#ifdef _DEBUG
                    memset(reinterpret_cast<void*>(pNode), 0, sizeof(USHRSynchCacheStackNode));
#endif
                    pNode->pointers.shrid = shridObj;
                    pNode->pointers.pNext = m_pHead;
                    m_pHead = pNode;
                    m_iDepth++;
                }
            }

            Unlock(pthrCurrent);       

            for (j=i;j<n;j++)
            {
                shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                if (NULLSharedID == shridObj)
                    break;
#ifdef _DEBUG
                pvObjRaw = SharedIDToPointer(shridObj);                
                memset(pvObjRaw, 0, sizeof(USHRSynchCacheStackNode));                
#endif
                shridpObjs[j] = shridObj;
            }
            
            for (i=0;i<j;i++)
            {           
                pvObjRaw = SharedIDToPointer(shridpObjs[i]);                
                new (pvObjRaw) T;            
            }
            
            return j;
        }